

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessEnergy
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  Value *pVVar5;
  undefined4 extraout_var;
  char *pcVar6;
  char *pcVar7;
  undefined4 extraout_var_00;
  EnergyReport *aEnergyReport;
  EnergyReportMap *aEnergyReportMap;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *this_01;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  uint8_t count;
  uint16_t scanDuration;
  uint16_t period;
  Address dstAddr;
  parse_func local_280 [1];
  uint32_t channelMask;
  Value local_270;
  string local_228;
  CommissionerAppPtr commissioner;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [40];
  Error local_190;
  undefined1 local_168 [40];
  undefined1 local_140 [40];
  undefined1 local_118 [40];
  undefined1 local_f0 [40];
  undefined1 local_c8 [40];
  undefined1 local_a0 [40];
  undefined1 local_78 [40];
  undefined1 local_50 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            ((Error *)local_c8,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &commissioner);
  Value::Value(&local_270,(Error *)local_c8);
  pVVar5 = Value::operator=(__return_storage_ptr__,&local_270);
  EVar1 = (pVVar5->mError).mCode;
  Value::~Value(&local_270);
  std::__cxx11::string::~string((string *)(local_c8 + 8));
  if (EVar1 != kNone) goto LAB_0011f7a8;
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)dstAddr.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
    dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "too few arguments";
    dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
    pcVar6 = "too few arguments";
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)&dstAddr);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&dstAddr;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_228,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    this_01 = (string *)(local_50 + 8);
    local_50._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(this_01,(string *)&local_228);
    Value::Value(&local_270,(Error *)local_50);
LAB_0011f77b:
    Value::operator=(__return_storage_ptr__,&local_270);
    Value::~Value(&local_270);
    std::__cxx11::string::~string(this_01);
    this_00 = &local_228;
  }
  else {
    std::__cxx11::string::string((string *)&local_270,"scan",(allocator *)&dstAddr);
    bVar3 = CaseInsensitiveEqual(pbVar2 + 1,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    if (!bVar3) {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_270,"report",(allocator *)&dstAddr);
      bVar3 = CaseInsensitiveEqual(pbVar2 + 1,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      if (bVar3) {
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(aExpr->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
          iVar4 = (*((commissioner.
                      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x4a])();
          std::
          _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
          ::_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                      *)&dstAddr,
                     (_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                      *)CONCAT44(extraout_var_00,iVar4));
          if (local_280[0] == (parse_func)0x0) {
            std::__cxx11::string::string((string *)&local_1f8,"null",(allocator *)&local_228);
          }
          else {
            EnergyReportMapToJson_abi_cxx11_(&local_1f8,(commissioner *)&dstAddr,aEnergyReportMap);
          }
          Value::Value(&local_270,&local_1f8);
          Value::operator=(__return_storage_ptr__,&local_270);
          Value::~Value(&local_270);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::
          _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
          ::~_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                       *)&dstAddr);
        }
        else {
          dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Address::Set((Error *)local_1b8,&dstAddr,pbVar2 + 2);
          Value::Value(&local_270,(Error *)local_1b8);
          pVVar5 = Value::operator=(__return_storage_ptr__,&local_270);
          EVar1 = (pVVar5->mError).mCode;
          Value::~Value(&local_270);
          std::__cxx11::string::~string((string *)(local_1b8 + 8));
          if (EVar1 == kNone) {
            iVar4 = (*((commissioner.
                        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x49])
                              (commissioner.
                               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&dstAddr);
            if ((commissioner *)CONCAT44(extraout_var,iVar4) == (commissioner *)0x0) {
              std::__cxx11::string::string((string *)&local_1d8,"null",(allocator *)&local_228);
            }
            else {
              EnergyReportToJson_abi_cxx11_
                        (&local_1d8,(commissioner *)CONCAT44(extraout_var,iVar4),aEnergyReport);
            }
            Value::Value(&local_270,&local_1d8);
            Value::operator=(__return_storage_ptr__,&local_270);
            Value::~Value(&local_270);
            std::__cxx11::string::~string((string *)&local_1d8);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dstAddr);
        }
        goto LAB_0011f7a8;
      }
      dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(dstAddr.mBytes.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0xd);
      dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "\'{}\' is not a valid sub-command";
      dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x1f;
      pcVar6 = "\'{}\' is not a valid sub-command";
      while (pcVar7 = pcVar6, pcVar7 != "") {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar7,"",(format_string_checker<char> *)&dstAddr);
        }
      }
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pbVar2[1]._M_dataplus._M_p;
      dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pbVar2[1]._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1f;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&dstAddr;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_228,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_01);
      this_01 = (string *)(local_a0 + 8);
      local_a0._0_4_ = kInvalidCommand;
      std::__cxx11::string::string(this_01,(string *)&local_228);
      Value::Value(&local_270,(Error *)local_a0);
      goto LAB_0011f77b;
    }
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0xc1) {
      dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)dstAddr.mBytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "too few arguments";
      dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x11;
      pcVar6 = "too few arguments";
      while (pcVar7 = pcVar6, pcVar7 != "") {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",(format_string_checker<char> *)&dstAddr);
        }
      }
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&dstAddr;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_228,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_00);
      this_01 = (string *)(local_78 + 8);
      local_78._0_4_ = kInvalidArgs;
      std::__cxx11::string::string(this_01,(string *)&local_228);
      Value::Value(&local_270,(Error *)local_78);
      goto LAB_0011f77b;
    }
    utils::ParseInteger<unsigned_int>((Error *)local_f0,&channelMask,pbVar2 + 2);
    Value::Value(&local_270,(Error *)local_f0);
    pVVar5 = Value::operator=(__return_storage_ptr__,&local_270);
    EVar1 = (pVVar5->mError).mCode;
    Value::~Value(&local_270);
    std::__cxx11::string::~string((string *)(local_f0 + 8));
    if (EVar1 != kNone) goto LAB_0011f7a8;
    utils::ParseInteger<unsigned_char>
              ((Error *)local_118,&count,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3);
    Value::Value(&local_270,(Error *)local_118);
    pVVar5 = Value::operator=(__return_storage_ptr__,&local_270);
    EVar1 = (pVVar5->mError).mCode;
    Value::~Value(&local_270);
    std::__cxx11::string::~string((string *)(local_118 + 8));
    if (EVar1 != kNone) goto LAB_0011f7a8;
    utils::ParseInteger<unsigned_short>
              ((Error *)local_140,&period,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 4);
    Value::Value(&local_270,(Error *)local_140);
    pVVar5 = Value::operator=(__return_storage_ptr__,&local_270);
    EVar1 = (pVVar5->mError).mCode;
    Value::~Value(&local_270);
    std::__cxx11::string::~string((string *)(local_140 + 8));
    if (EVar1 != kNone) goto LAB_0011f7a8;
    utils::ParseInteger<unsigned_short>
              ((Error *)local_168,&scanDuration,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 5);
    Value::Value(&local_270,(Error *)local_168);
    pVVar5 = Value::operator=(__return_storage_ptr__,&local_270);
    EVar1 = (pVVar5->mError).mCode;
    Value::~Value(&local_270);
    std::__cxx11::string::~string((string *)(local_168 + 8));
    if (EVar1 != kNone) goto LAB_0011f7a8;
    (*((commissioner.
        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_CommissionerHandler)._vptr_CommissionerHandler[0x48])
              (&local_190,
               commissioner.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(ulong)channelMask,(ulong)count,(ulong)period,(ulong)scanDuration,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 6);
    Value::Value(&local_270,&local_190);
    Value::operator=(__return_storage_ptr__,&local_270);
    Value::~Value(&local_270);
    this_00 = &local_190.mMessage;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0011f7a8:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&commissioner.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessEnergy(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "scan"))
    {
        uint32_t channelMask;
        uint8_t  count;
        uint16_t period;
        uint16_t scanDuration;
        VerifyOrExit(aExpr.size() >= 7, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(channelMask, aExpr[2]));
        SuccessOrExit(value = ParseInteger(count, aExpr[3]));
        SuccessOrExit(value = ParseInteger(period, aExpr[4]));
        SuccessOrExit(value = ParseInteger(scanDuration, aExpr[5]));
        SuccessOrExit(value = commissioner->EnergyScan(channelMask, count, period, scanDuration, aExpr[6]));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "report"))
    {
        if (aExpr.size() >= 3)
        {
            const EnergyReport *report = nullptr;
            Address             dstAddr;
            SuccessOrExit(value = dstAddr.Set(aExpr[2]));
            report = commissioner->GetEnergyReport(dstAddr);
            value  = report == nullptr ? "null" : EnergyReportToJson(*report);
        }
        else
        {
            auto reports = commissioner->GetAllEnergyReports();
            value        = reports.empty() ? "null" : EnergyReportMapToJson(reports);
        }
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}